

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXBinaryTokenizer.cpp
# Opt level: O0

void Assimp::FBX::anon_unknown_3::TokenizeError(string *message,size_t offset)

{
  DeadlyImportError *this;
  allocator<char> local_59;
  string local_58;
  string local_38;
  size_t local_18;
  size_t offset_local;
  string *message_local;
  
  local_18 = offset;
  offset_local = (size_t)message;
  this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"FBX-Tokenize",&local_59);
  Util::AddOffset(&local_38,&local_58,(string *)offset_local,local_18);
  DeadlyImportError::DeadlyImportError(this,&local_38);
  __cxa_throw(this,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

AI_WONT_RETURN void TokenizeError(const std::string& message, size_t offset)
{
    throw DeadlyImportError(Util::AddOffset("FBX-Tokenize",message,offset));
}